

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

void __thiscall
QGraphicsAnchorLayoutPrivate::identifyFloatItems
          (QGraphicsAnchorLayoutPrivate *this,QSet<QtGraphicsAnchorLayout::AnchorData_*> *visited,
          Orientation orientation)

{
  long lVar1;
  QGraphicsLayoutItem **ppQVar2;
  QHash<QGraphicsLayoutItem_*,_QHashDummyValue> QVar3;
  ulong uVar4;
  Node<QGraphicsLayoutItem_*,_QHashDummyValue> *pNVar5;
  ulong uVar6;
  long lVar7;
  Data *pDVar8;
  long in_FS_OFFSET;
  QGraphicsLayoutItem *item;
  QHash<QGraphicsLayoutItem_*,_QHashDummyValue> moved;
  Data *local_60;
  QHash<QGraphicsLayoutItem_*,_QHashDummyValue> local_58;
  QHash<QGraphicsLayoutItem_*,_QHashDummyValue> local_50;
  QHashDummyValue local_41;
  QHash<QGraphicsLayoutItem_*,_QHashDummyValue> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d = (Data *)0x0;
  pDVar8 = (visited->q_hash).d;
  if (pDVar8 == (Data *)0x0) {
    pDVar8 = (Data *)0x0;
  }
  else if (pDVar8->spans->offsets[0] == 0xff) {
    uVar4 = 1;
    do {
      uVar6 = uVar4;
      if (pDVar8->numBuckets == uVar6) {
        pDVar8 = (Data *)0x0;
        uVar6 = 0;
        break;
      }
      uVar4 = uVar6 + 1;
    } while (pDVar8->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
    goto LAB_005cfaac;
  }
  uVar6 = 0;
LAB_005cfaac:
  if (uVar6 != 0 || pDVar8 != (Data *)0x0) {
    do {
      identifyNonFloatItems_helper
                (this,*(AnchorData **)
                       pDVar8->spans[uVar6 >> 7].entries
                       [pDVar8->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f]].storage.data,
                 (QSet<QGraphicsLayoutItem_*> *)&local_50);
      do {
        if (pDVar8->numBuckets - 1 == uVar6) {
          uVar6 = 0;
          pDVar8 = (Data *)0x0;
          break;
        }
        uVar6 = uVar6 + 1;
      } while (pDVar8->spans[uVar6 >> 7].offsets[(uint)uVar6 & 0x7f] == 0xff);
    } while (uVar6 != 0 || pDVar8 != (Data *)0x0);
  }
  local_58.d = (Data *)0x0;
  lVar1 = (this->items).d.size;
  if (lVar1 != 0) {
    ppQVar2 = (this->items).d.ptr;
    lVar7 = 0;
    do {
      local_60 = *(Data **)((long)ppQVar2 + lVar7);
      if ((local_50.d == (Data *)0x0) ||
         (pNVar5 = QHashPrivate::Data<QHashPrivate::Node<QGraphicsLayoutItem*,QHashDummyValue>>::
                   findNode<QGraphicsLayoutItem*>
                             ((Data<QHashPrivate::Node<QGraphicsLayoutItem*,QHashDummyValue>> *)
                              local_50.d,(QGraphicsLayoutItem **)&local_60),
         pNVar5 == (Node<QGraphicsLayoutItem_*,_QHashDummyValue> *)0x0)) {
        local_40.d = local_60;
        QHash<QGraphicsLayoutItem*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                  ((QHash<QGraphicsLayoutItem*,QHashDummyValue> *)&local_58,
                   (QGraphicsLayoutItem **)&local_40,&local_41);
      }
      lVar7 = lVar7 + 8;
    } while (lVar1 << 3 != lVar7);
  }
  QVar3.d = local_58.d;
  local_58.d = (Data *)0x0;
  local_40.d = *(Data **)(&this->graphHasConflicts + (long)(int)orientation * 4);
  *(Data **)(&this->graphHasConflicts + (long)(int)orientation * 4) = QVar3.d;
  QHash<QGraphicsLayoutItem_*,_QHashDummyValue>::~QHash(&local_40);
  QHash<QGraphicsLayoutItem_*,_QHashDummyValue>::~QHash(&local_58);
  QHash<QGraphicsLayoutItem_*,_QHashDummyValue>::~QHash(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::identifyFloatItems(const QSet<AnchorData *> &visited, Qt::Orientation orientation)
{
    QSet<QGraphicsLayoutItem *> nonFloating;

    for (const AnchorData *ad : visited)
        identifyNonFloatItems_helper(ad, &nonFloating);

    QSet<QGraphicsLayoutItem *> floatItems;
    for (QGraphicsLayoutItem *item : std::as_const(items)) {
        if (!nonFloating.contains(item))
            floatItems.insert(item);
    }
    m_floatItems[orientation] = std::move(floatItems);
}